

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase347::run(TestCase347 *this)

{
  int iVar1;
  __pid_t _Var2;
  int local_9c;
  WaitScope waitScope;
  PromiseFulfillerPair<kj::Promise<int>_> pair;
  __pid_t local_64;
  PromiseFulfillerPair<int> inner;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  newPromiseAndFulfiller<kj::Promise<int>>();
  newPromiseAndFulfiller<int>();
  iVar1 = (*(pair.fulfiller.ptr)->_vptr_PromiseFulfiller[2])();
  if ((char)iVar1 == '\0' && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x162,ERROR,"\"failed: expected \" \"pair.fulfiller->isWaiting()\"",
               (char (*) [45])"failed: expected pair.fulfiller->isWaiting()");
  }
  (**(pair.fulfiller.ptr)->_vptr_PromiseFulfiller)(pair.fulfiller.ptr,&inner);
  iVar1 = (*(pair.fulfiller.ptr)->_vptr_PromiseFulfiller[2])();
  if (((byte)iVar1 & _::Debug::minSeverity < 3) == 1) {
    _::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x164,ERROR,"\"failed: expected \" \"!(pair.fulfiller->isWaiting())\"",
               (char (*) [48])"failed: expected !(pair.fulfiller->isWaiting())");
  }
  local_9c = 0x7b;
  (**(inner.fulfiller.ptr)->_vptr_PromiseFulfiller)();
  _Var2 = Promise<int>::wait(&pair.promise,&waitScope);
  if ((_Var2 != 0x7b) && (_::Debug::minSeverity < 3)) {
    local_9c = 0x7b;
    local_64 = Promise<int>::wait(&pair.promise,&waitScope);
    _::Debug::log<char_const(&)[57],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x168,ERROR,
               "\"failed: expected \" \"(123) == (pair.promise.wait(waitScope))\", 123, pair.promise.wait(waitScope)"
               ,(char (*) [57])"failed: expected (123) == (pair.promise.wait(waitScope))",&local_9c,
               &local_64);
  }
  PromiseFulfillerPair<int>::~PromiseFulfillerPair(&inner);
  PromiseFulfillerPair<kj::Promise<int>_>::~PromiseFulfillerPair(&pair);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, SeparateFulfillerChained) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto pair = newPromiseAndFulfiller<Promise<int>>();
  auto inner = newPromiseAndFulfiller<int>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.fulfiller->fulfill(kj::mv(inner.promise));
  EXPECT_FALSE(pair.fulfiller->isWaiting());

  inner.fulfiller->fulfill(123);

  EXPECT_EQ(123, pair.promise.wait(waitScope));
}